

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O0

void __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
          (InputParameter<3UL,_ruckig::StandardVector> *this)

{
  InputParameter<3UL,_ruckig::StandardVector> *this_local;
  
  std::optional<std::vector<double,_std::allocator<double>_>_>::~optional
            (&this->per_section_minimum_duration);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  ~optional(&this->per_section_min_position);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  ~optional(&this->per_section_max_position);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  ~optional(&this->per_section_min_acceleration);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  ~optional(&this->per_section_min_velocity);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  ~optional(&this->per_section_max_jerk);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  ~optional(&this->per_section_max_acceleration);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  ~optional(&this->per_section_max_velocity);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
            (&this->intermediate_positions);
  return;
}

Assistant:

inline static double v_at_a_zero(double v0, double a0, double j) {
        return v0 + (a0 * a0) / (2 * j);
    }